

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::operator*(Mat *this,Mat *a)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int k_3;
  int k_2;
  int k_1;
  int k;
  int i_1;
  int j_1;
  int j;
  int i;
  int tmp_c;
  Mat *ret;
  undefined8 in_stack_ffffffffffffff28;
  ulong uVar15;
  Mat *in_stack_ffffffffffffff30;
  ulong uVar16;
  Mat *in_stack_ffffffffffffff40;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_30;
  int local_2c;
  
  iVar10 = cols(in_RDX);
  cols(in_RDX);
  Mat(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
      (int)in_stack_ffffffffffffff28);
  for (local_2c = 0; local_2c < iVar10; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_RSI->r; local_30 = local_30 + 1) {
      iVar11 = pair_order_type(in_RSI,in_RDX);
      switch(iVar11) {
      case 0:
        for (local_40 = 0; local_40 < in_RSI->c; local_40 = local_40 + 1) {
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RSI->val,(long)(local_40 * in_RSI->r + local_30));
          uVar15 = *puVar13;
          uVar16 = puVar13[1];
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDX->val,(long)(local_2c * in_RSI->c + local_40));
          uVar12 = *puVar13;
          uVar1 = puVar13[1];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar15;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar12;
          uVar14 = SUB168(auVar2 * auVar6,0);
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDI->val,(long)(local_2c * in_RSI->r + local_30));
          puVar13[1] = puVar13[1] + SUB168(auVar2 * auVar6,8) + uVar15 * uVar1 + uVar16 * uVar12 +
                       (ulong)CARRY8(*puVar13,uVar14);
          *puVar13 = *puVar13 + uVar14;
        }
        break;
      case 1:
        for (local_44 = 0; local_44 < in_RSI->c; local_44 = local_44 + 1) {
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RSI->val,(long)(local_44 * in_RSI->r + local_30));
          uVar15 = *puVar13;
          uVar16 = puVar13[1];
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDX->val,(long)(local_44 * iVar10 + local_2c));
          uVar12 = *puVar13;
          uVar1 = puVar13[1];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar15;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar12;
          uVar14 = SUB168(auVar3 * auVar7,0);
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDI->val,(long)(local_2c * in_RSI->r + local_30));
          puVar13[1] = puVar13[1] + SUB168(auVar3 * auVar7,8) + uVar15 * uVar1 + uVar16 * uVar12 +
                       (ulong)CARRY8(*puVar13,uVar14);
          *puVar13 = *puVar13 + uVar14;
        }
        break;
      case 2:
        for (local_48 = 0; local_48 < in_RSI->c; local_48 = local_48 + 1) {
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RSI->val,(long)(local_30 * in_RSI->c + local_48));
          uVar15 = *puVar13;
          uVar16 = puVar13[1];
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDX->val,(long)(local_2c * in_RSI->c + local_48));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar15;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *puVar13;
          uVar12 = SUB168(auVar4 * auVar8,0);
          in_stack_ffffffffffffff40 =
               (Mat *)(SUB168(auVar4 * auVar8,8) + uVar15 * puVar13[1] + uVar16 * *puVar13);
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDI->val,(long)(local_2c * in_RSI->r + local_30));
          puVar13[1] = (long)&in_stack_ffffffffffffff40->r +
                       (ulong)CARRY8(*puVar13,uVar12) + puVar13[1];
          *puVar13 = *puVar13 + uVar12;
        }
        break;
      case 3:
        for (local_4c = 0; local_4c < in_RSI->c; local_4c = local_4c + 1) {
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RSI->val,(long)(local_30 * in_RSI->c + local_4c));
          uVar15 = *puVar13;
          uVar16 = puVar13[1];
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDX->val,(long)(local_4c * iVar10 + local_2c));
          uVar12 = *puVar13;
          uVar1 = puVar13[1];
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar15;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = uVar12;
          uVar14 = SUB168(auVar5 * auVar9,0);
          puVar13 = (ulong *)std::vector<__int128,_std::allocator<__int128>_>::operator[]
                                       (&in_RDI->val,(long)(local_2c * in_RSI->r + local_30));
          puVar13[1] = puVar13[1] + SUB168(auVar5 * auVar9,8) + uVar15 * uVar1 + uVar16 * uVar12 +
                       (ulong)CARRY8(*puVar13,uVar14);
          *puVar13 = *puVar13 + uVar14;
        }
      }
    }
  }
  residual(in_stack_ffffffffffffff40);
  return in_RDI;
}

Assistant:

Mat Mat::operator*(const Mat &a) {
    int tmp_c;
    tmp_c = a.cols();
    Mat ret(r, a.cols());
    int i, j;
    for (int j = 0; j < tmp_c; j++) {
        for (int i = 0; i < r; i++) {
            switch (pair_order_type(this, &a)) {
                case MM_NN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[j * c + k];
                    }
                    break;
                case MM_NT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[k * r + i] * a.val[k * tmp_c + j];
                    }
                    break;
                case MM_TN:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[j * c + k];
                    }
                    break;
                case MM_TT:
                    for (int k = 0; k < c; k++) {
                        ret.val[j * r + i] += val[i * c + k] * a.val[k * tmp_c + j];
                    }
                    break;
            }
        }
    }
    ret.residual();
    return ret;
}